

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task28.cpp
# Opt level: O3

void Bozo_sort(int *arr,int len,Order type)

{
  bool bVar1;
  undefined4 in_EAX;
  int iVar2;
  int iVar3;
  int iVar4;
  ostream *poVar5;
  ulong uVar6;
  undefined4 uStack_38;
  int local_34;
  
  uStack_38 = in_EAX;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"BOZO ARR",8);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
  std::ostream::put(-0x78);
  std::ostream::flush();
  if (type == DESC) {
    bVar1 = is_sort(arr,len,DESC);
    if (!bVar1) {
      _uStack_38 = CONCAT44(len + -1,uStack_38);
      do {
        iVar2 = rand();
        iVar2 = iVar2 % len;
        iVar3 = rand();
        iVar4 = (uint)(iVar2 <= iVar3 % local_34) + iVar3 % local_34;
        iVar3 = arr[iVar2];
        arr[iVar2] = arr[iVar4];
        arr[iVar4] = iVar3;
        if (0 < len) {
          uVar6 = 0;
          do {
            poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,arr[uVar6]);
            uStack_38._0_3_ = CONCAT12(0x20,(undefined2)uStack_38);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar5,(char *)((long)&uStack_38 + 2),1);
            uVar6 = uVar6 + 1;
          } while ((uint)len != uVar6);
        }
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
        std::ostream::put(-0x78);
        std::ostream::flush();
        bVar1 = is_sort(arr,len,DESC);
      } while (!bVar1);
    }
  }
  else if ((type == ABC) && (bVar1 = is_sort(arr,len,ABC), !bVar1)) {
    _uStack_38 = CONCAT44(len + -1,uStack_38);
    do {
      iVar2 = rand();
      iVar2 = iVar2 % len;
      iVar3 = rand();
      iVar4 = (uint)(iVar3 % local_34 <= iVar2) + iVar3 % local_34;
      iVar3 = arr[iVar2];
      arr[iVar2] = arr[iVar4];
      arr[iVar4] = iVar3;
      if (0 < len) {
        uVar6 = 0;
        do {
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,arr[uVar6]);
          uStack_38 = CONCAT13(0x20,(undefined3)uStack_38);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5,(char *)((long)&uStack_38 + 3),1);
          uVar6 = uVar6 + 1;
        } while ((uint)len != uVar6);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
      std::ostream::put(-0x78);
      std::ostream::flush();
      bVar1 = is_sort(arr,len,ABC);
    } while (!bVar1);
  }
  return;
}

Assistant:

void Bozo_sort(int* arr, int len, Order type = ABC){
    cout << "BOZO ARR" << endl;
    switch (type) {
        case DESC:
            while (!is_sort(arr, len, type)) {
                int index1 = rand() % len;
                int index2 = rand() % (len - 1);
                if (index2 >= index1) index2++;
                swap(arr[index1], arr[index2]);

                for (int i = 0; i < len; i++) cout << arr[i] << ' ';
                cout << endl;
            }
            break;
        case ABC:
            while (!is_sort(arr, len, type)) {
                int index1 = rand() % len;
                int index2 = rand() % (len - 1);
                if (index2 <= index1) index2++;
                swap(arr[index1], arr[index2]);

                for (int i = 0; i < len; i++) cout << arr[i] << ' ';
                cout << endl;
            }
            break;
    }
}